

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O0

ssize_t __thiscall DepthBuffer::write(DepthBuffer *this,int __fd,void *__buf,size_t __n)

{
  ulong y;
  size_t x;
  undefined8 __s;
  const_reference pvVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  allocator<char> local_89;
  string local_88;
  TGAColor local_55;
  ulong local_50;
  size_t j;
  size_t i;
  TGAImage image;
  char *filename_local;
  DepthBuffer *this_local;
  
  image._36_4_ = in_register_00000034;
  image.bytespp = __fd;
  TGAImage::TGAImage((TGAImage *)&i,this->width,this->height,1);
  for (j = 0; __s = image._32_8_, j < this->width; j = j + 1) {
    for (local_50 = 0; x = j, y = local_50, local_50 < this->height; local_50 = local_50 + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->data,j * this->width + local_50);
      TGAColor::TGAColor(&local_55,(uint8_t)(int)*pvVar1);
      TGAImage::set((TGAImage *)&i,x,y,&local_55);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,(char *)__s,&local_89);
  TGAImage::write_tga_file((TGAImage *)&i,&local_88,true,true);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  TGAImage::~TGAImage((TGAImage *)&i);
  return extraout_RAX;
}

Assistant:

void DepthBuffer::write(const char *filename) const
{
    TGAImage image(width, height, TGAImage::GRAYSCALE);
    for (size_t i = 0; i < width; i++) {
        for (size_t j = 0; j < height; j++) {
            image.set(i, j, TGAColor(static_cast<uint8_t>(data[i * width + j])));
        }
    }
    image.write_tga_file(filename);
}